

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O0

int __thiscall ncnn::Crop::forward(Crop *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  int *piVar2;
  int __flags;
  long in_RSI;
  long in_RDI;
  void *in_R8;
  Mat borderm;
  Mat m;
  int q;
  Mat bottom_blob_sliced;
  int end;
  int start;
  int axis_1;
  int i_1;
  int axis;
  int i;
  int num_axis;
  int _axes [4];
  int *axes_ptr;
  int *ends_ptr;
  int *starts_ptr;
  bool numpy_style_slice;
  int _outc;
  int _outh;
  int _outw;
  int _coffset2;
  int _hoffset2;
  int _woffset2;
  int _coffset;
  int _hoffset;
  int _woffset;
  size_t elemsize;
  int dims;
  int channels;
  int h;
  int w;
  int in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  int in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  int in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc4;
  int in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  int in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  int local_228;
  int local_224;
  byte local_211;
  int local_18c;
  Mat local_178;
  undefined1 local_138 [68];
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98 [6];
  int *local_80;
  int *local_78;
  int *local_70;
  byte local_65;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  long local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c [10];
  int local_4;
  
  local_2c[0] = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_34 = *(int *)(in_RSI + 0x34);
  local_38 = *(int *)(in_RSI + 0x28);
  local_40 = *(long *)(in_RSI + 0x10);
  local_44 = *(int *)(in_RDI + 0x80);
  local_48 = *(int *)(in_RDI + 0x84);
  local_4c = *(int *)(in_RDI + 0x88);
  local_50 = *(int *)(in_RDI + 0x98);
  local_54 = *(int *)(in_RDI + 0x9c);
  local_58 = *(int *)(in_RDI + 0xa0);
  bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  local_211 = 0;
  if (!bVar1) {
    bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
    local_211 = bVar1 ^ 0xff;
  }
  local_65 = local_211 & 1;
  if (local_65 == 0) {
    if (local_38 == 1) {
      if (*(int *)(in_RDI + 0x8c) == -0xe9) {
        local_5c = (local_2c[0] - local_44) - local_50;
      }
      else {
        local_d0 = (local_2c[0] - local_44) - local_50;
        piVar2 = std::min<int>((int *)(in_RDI + 0x8c),&local_d0);
        local_5c = *piVar2;
      }
    }
    if (local_38 == 2) {
      if (local_48 == -0xe9) {
        local_44 = 0;
        local_50 = 0;
        local_5c = local_2c[0];
        local_48 = *(int *)(in_RDI + 0x80);
        local_54 = *(int *)(in_RDI + 0x98);
        if (*(int *)(in_RDI + 0x8c) == -0xe9) {
          local_60 = (local_30 - local_48) - local_54;
        }
        else {
          local_d4 = (local_30 - local_48) - local_54;
          piVar2 = std::min<int>((int *)(in_RDI + 0x8c),&local_d4);
          local_60 = *piVar2;
        }
      }
      else {
        if (*(int *)(in_RDI + 0x8c) == -0xe9) {
          local_5c = (local_2c[0] - local_44) - local_50;
        }
        else {
          local_d8 = (local_2c[0] - local_44) - local_50;
          piVar2 = std::min<int>((int *)(in_RDI + 0x8c),&local_d8);
          local_5c = *piVar2;
        }
        if (*(int *)(in_RDI + 0x90) == -0xe9) {
          local_60 = (local_30 - local_48) - local_54;
        }
        else {
          local_dc = (local_30 - local_48) - local_54;
          piVar2 = std::min<int>((int *)(in_RDI + 0x90),&local_dc);
          local_60 = *piVar2;
        }
      }
    }
    if (local_38 == 3) {
      if ((local_48 == -0xe9) && (local_4c == -0xe9)) {
        local_44 = 0;
        local_50 = 0;
        local_5c = local_2c[0];
        local_48 = 0;
        local_54 = 0;
        local_60 = local_30;
        local_4c = *(int *)(in_RDI + 0x80);
        local_58 = *(int *)(in_RDI + 0x98);
        if (*(int *)(in_RDI + 0x8c) == -0xe9) {
          local_64 = (local_34 - local_4c) - local_58;
        }
        else {
          local_e0 = (local_34 - local_4c) - local_58;
          piVar2 = std::min<int>((int *)(in_RDI + 0x8c),&local_e0);
          local_64 = *piVar2;
        }
      }
      else if (local_48 == -0xe9) {
        local_44 = 0;
        local_50 = 0;
        local_5c = local_2c[0];
        local_48 = *(int *)(in_RDI + 0x80);
        local_54 = *(int *)(in_RDI + 0x98);
        if (*(int *)(in_RDI + 0x8c) == -0xe9) {
          local_60 = (local_30 - local_48) - local_54;
        }
        else {
          local_e4 = (local_30 - local_48) - local_54;
          piVar2 = std::min<int>((int *)(in_RDI + 0x8c),&local_e4);
          local_60 = *piVar2;
        }
        local_4c = *(int *)(in_RDI + 0x84);
        local_58 = *(int *)(in_RDI + 0x9c);
        if (*(int *)(in_RDI + 0x90) == -0xe9) {
          local_64 = (local_34 - local_4c) - local_58;
        }
        else {
          local_e8 = (local_34 - local_4c) - local_58;
          piVar2 = std::min<int>((int *)(in_RDI + 0x90),&local_e8);
          local_64 = *piVar2;
        }
      }
      else {
        if (*(int *)(in_RDI + 0x8c) == -0xe9) {
          local_5c = (local_2c[0] - local_44) - local_50;
        }
        else {
          local_ec = (local_2c[0] - local_44) - local_50;
          piVar2 = std::min<int>((int *)(in_RDI + 0x8c),&local_ec);
          local_5c = *piVar2;
        }
        if (*(int *)(in_RDI + 0x90) == -0xe9) {
          local_60 = (local_30 - local_48) - local_54;
        }
        else {
          local_f0 = (local_30 - local_48) - local_54;
          piVar2 = std::min<int>((int *)(in_RDI + 0x90),&local_f0);
          local_60 = *piVar2;
        }
        if (*(int *)(in_RDI + 0x94) == -0xe9) {
          local_64 = (local_34 - local_4c) - local_58;
        }
        else {
          local_f4 = (local_34 - local_4c) - local_58;
          piVar2 = std::min<int>((int *)(in_RDI + 0x94),&local_f4);
          local_64 = *piVar2;
        }
      }
    }
  }
  else {
    local_44 = 0;
    local_48 = 0;
    local_4c = 0;
    local_5c = local_2c[0];
    local_60 = local_30;
    local_64 = local_34;
    local_70 = Mat::operator_cast_to_int_((Mat *)(in_RDI + 0xa8));
    local_78 = Mat::operator_cast_to_int_((Mat *)(in_RDI + 0xe8));
    local_80 = Mat::operator_cast_to_int_((Mat *)(in_RDI + 0x128));
    local_98[0] = 0;
    local_98[1] = 1;
    local_98[2] = 2;
    local_98[3] = 3;
    local_9c = *(int *)(in_RDI + 0x154);
    if (local_9c == 0) {
      local_9c = local_38 + 1;
    }
    else {
      for (local_a0 = 0; local_a0 < local_9c; local_a0 = local_a0 + 1) {
        local_a4 = local_80[local_a0];
        if (local_a4 < 0) {
          local_a4 = local_38 + 1 + local_a4;
        }
        local_98[local_a0] = local_a4;
      }
    }
    for (local_a8 = 0; local_a8 < local_9c; local_a8 = local_a8 + 1) {
      local_ac = local_98[local_a8];
      if (local_ac != 0) {
        local_b0 = local_70[local_a8];
        local_b4 = local_78[local_a8];
        if (local_38 == 1) {
          local_224 = local_b0;
          if (local_b0 < 0) {
            local_224 = local_2c[0] + local_b0;
          }
          local_44 = local_224;
          local_228 = local_b4;
          if (local_b4 < 1) {
            local_228 = local_2c[0] + local_b4;
          }
          local_b8 = local_228;
          piVar2 = std::min<int>(local_2c,&local_b8);
          local_5c = *piVar2 - local_44;
        }
        if (local_38 == 2) {
          if (local_ac == 1) {
            in_stack_fffffffffffffdd4 = local_b0;
            if (local_b0 < 0) {
              in_stack_fffffffffffffdd4 = local_30 + local_b0;
            }
            in_stack_fffffffffffffdd0 = local_b4;
            if (local_b4 < 1) {
              in_stack_fffffffffffffdd0 = local_30 + local_b4;
            }
            local_bc = in_stack_fffffffffffffdd0;
            local_48 = in_stack_fffffffffffffdd4;
            piVar2 = std::min<int>(&local_30,&local_bc);
            local_60 = *piVar2 - local_44;
          }
          if (local_ac == 2) {
            in_stack_fffffffffffffdcc = local_b0;
            if (local_b0 < 0) {
              in_stack_fffffffffffffdcc = local_2c[0] + local_b0;
            }
            in_stack_fffffffffffffdc8 = local_b4;
            if (local_b4 < 1) {
              in_stack_fffffffffffffdc8 = local_2c[0] + local_b4;
            }
            local_c0 = in_stack_fffffffffffffdc8;
            local_44 = in_stack_fffffffffffffdcc;
            piVar2 = std::min<int>(local_2c,&local_c0);
            local_5c = *piVar2 - local_44;
          }
        }
        if (local_38 == 3) {
          if (local_ac == 1) {
            in_stack_fffffffffffffdc4 = local_b0;
            if (local_b0 < 0) {
              in_stack_fffffffffffffdc4 = local_34 + local_b0;
            }
            in_stack_fffffffffffffdc0 = local_b4;
            if (local_b4 < 1) {
              in_stack_fffffffffffffdc0 = local_34 + local_b4;
            }
            local_c4 = in_stack_fffffffffffffdc0;
            local_4c = in_stack_fffffffffffffdc4;
            piVar2 = std::min<int>(&local_34,&local_c4);
            local_64 = *piVar2 - local_4c;
          }
          if (local_ac == 2) {
            in_stack_fffffffffffffdbc = local_b0;
            if (local_b0 < 0) {
              in_stack_fffffffffffffdbc = local_30 + local_b0;
            }
            in_stack_fffffffffffffdb8 = local_b4;
            if (local_b4 < 1) {
              in_stack_fffffffffffffdb8 = local_30 + local_b4;
            }
            local_c8 = in_stack_fffffffffffffdb8;
            local_48 = in_stack_fffffffffffffdbc;
            piVar2 = std::min<int>(&local_30,&local_c8);
            local_60 = *piVar2 - local_44;
          }
          if (local_ac == 3) {
            in_stack_fffffffffffffdb4 = local_b0;
            if (local_b0 < 0) {
              in_stack_fffffffffffffdb4 = local_2c[0] + local_b0;
            }
            in_stack_fffffffffffffdb0 = local_b4;
            if (local_b4 < 1) {
              in_stack_fffffffffffffdb0 = local_2c[0] + local_b4;
            }
            local_cc = in_stack_fffffffffffffdb0;
            local_44 = in_stack_fffffffffffffdb4;
            piVar2 = std::min<int>(local_2c,&local_cc);
            local_5c = *piVar2 - local_44;
          }
        }
      }
    }
  }
  if (local_38 == 1) {
    if (local_5c == local_2c[0]) {
      Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                     (Mat *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
      local_4 = 0;
    }
    else {
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                  in_stack_fffffffffffffdcc,
                  CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                  (Allocator *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
      if (bVar1) {
        local_4 = -100;
      }
      else {
        if (local_40 == 1) {
          copy_cut_border_image<signed_char>
                    ((Mat *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     (Mat *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0);
        }
        else if (local_40 == 4) {
          copy_cut_border_image<float>
                    ((Mat *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     (Mat *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0);
        }
        local_4 = 0;
      }
    }
  }
  else if (local_38 == 2) {
    if ((local_5c == local_2c[0]) && (local_60 == local_30)) {
      Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                     (Mat *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
      local_4 = 0;
    }
    else {
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                  in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8,
                  CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                  (Allocator *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
      if (bVar1) {
        local_4 = -100;
      }
      else {
        if (local_40 == 1) {
          copy_cut_border_image<signed_char>
                    ((Mat *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     (Mat *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0);
        }
        else if (local_40 == 4) {
          copy_cut_border_image<float>
                    ((Mat *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     (Mat *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0);
        }
        local_4 = 0;
      }
    }
  }
  else if (local_38 == 3) {
    if (((local_5c == local_2c[0]) && (local_60 == local_30)) && (local_64 == local_34)) {
      Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                     (Mat *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
      local_4 = 0;
    }
    else {
      __flags = local_64;
      Mat::channel_range((Mat *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                         in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0);
      if ((local_5c == local_2c[0]) && (local_60 == local_30)) {
        Mat::clone(&local_178,(__fn *)local_138,(void *)0x0,__flags,in_R8);
        Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                       (Mat *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
        Mat::~Mat((Mat *)0x14fd22);
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
        if (bVar1) {
          local_4 = -100;
        }
        else {
          local_4 = 0;
        }
      }
      else {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                    in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4,
                    CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                    (Allocator *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
        if (bVar1) {
          local_4 = -100;
        }
        else {
          for (local_18c = 0; local_18c < local_64; local_18c = local_18c + 1) {
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                         in_stack_fffffffffffffdb4);
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                         in_stack_fffffffffffffdb4);
            if (local_40 == 1) {
              copy_cut_border_image<signed_char>
                        ((Mat *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                         (Mat *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                         in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0);
            }
            else if (local_40 == 4) {
              copy_cut_border_image<float>
                        ((Mat *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                         (Mat *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                         in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0);
            }
            Mat::~Mat((Mat *)0x14ff1c);
            Mat::~Mat((Mat *)0x14ff29);
          }
          local_4 = 0;
        }
      }
      Mat::~Mat((Mat *)0x14ff71);
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Crop::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int _woffset = woffset;
    int _hoffset = hoffset;
    int _coffset = coffset;
    int _woffset2 = woffset2;
    int _hoffset2 = hoffset2;
    int _coffset2 = coffset2;
    int _outw;
    int _outh;
    int _outc;

    bool numpy_style_slice = !starts.empty() && !ends.empty();
    if (numpy_style_slice)
    {
        _woffset = 0;
        _hoffset = 0;
        _coffset = 0;
        _outw = w;
        _outh = h;
        _outc = channels;

        const int* starts_ptr = starts;
        const int* ends_ptr = ends;
        const int* axes_ptr = axes;

        int _axes[4] = {0,1,2,3};
        int num_axis = axes.w;
        if (num_axis == 0)
        {
            num_axis = dims + 1;// +1 for N-dim
        }
        else
        {
            for (int i=0; i<num_axis; i++)
            {
                int axis = axes_ptr[i];
                if (axis < 0)
                    axis = dims + 1 + axis;// +1 for N-dim
                _axes[i] = axis;
            }
        }

        for (int i=0; i<num_axis; i++)
        {
            int axis = _axes[i];
            if (axis == 0)
                continue;// skip N-dim

            int start = starts_ptr[i];
            int end = ends_ptr[i];

            if (dims == 1) // axis == 1
            {
                _woffset = start >= 0 ? start : w + start;
                _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
            }
            if (dims == 2)
            {
                if (axis == 1)
                {
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _woffset;
                }
                if (axis == 2)
                {
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
            if (dims == 3)
            {
                if (axis == 1)
                {
                    _coffset = start >= 0 ? start : channels + start;
                    _outc = std::min(channels, end > 0 ? end : channels + end) - _coffset;
                }
                if (axis == 2)
                {
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _woffset;
                }
                if (axis == 3)
                {
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
        }
    }
    else
    {
        if (dims == 1)
        {
            if (outw == -233)
                _outw = w - _woffset - _woffset2;
            else
                _outw = std::min(outw, w - _woffset - _woffset2);
        }
        if (dims == 2)
        {
            if (_hoffset == -233)
            {
                _woffset = 0;
                _woffset2 = 0;
                _outw = w;

                _hoffset = woffset;
                _hoffset2 = woffset2;

                if (outw == -233)
                    _outh = h - _hoffset - _hoffset2;
                else
                    _outh = std::min(outw, h - _hoffset - _hoffset2);
            }
            else
            {
                if (outw == -233)
                    _outw = w - _woffset - _woffset2;
                else
                    _outw = std::min(outw, w - _woffset - _woffset2);

                if (outh == -233)
                    _outh = h - _hoffset - _hoffset2;
                else
                    _outh = std::min(outh, h - _hoffset - _hoffset2);
            }
        }
        if (dims == 3)
        {
            if (_hoffset == -233 && _coffset == -233)
            {
                _woffset = 0;
                _woffset2 = 0;
                _outw = w;
                _hoffset = 0;
                _hoffset2 = 0;
                _outh = h;

                _coffset = woffset;
                _coffset2 = woffset2;

                if (outw == -233)
                    _outc = channels - _coffset - _coffset2;
                else
                    _outc = std::min(outw, channels - _coffset - _coffset2);
            }
            else if (_hoffset == -233)
            {
                _woffset = 0;
                _woffset2 = 0;
                _outw = w;

                _hoffset = woffset;
                _hoffset2 = woffset2;

                if (outw == -233)
                    _outh = h - _hoffset - _hoffset2;
                else
                    _outh = std::min(outw, h - _hoffset - _hoffset2);

                _coffset = hoffset;
                _coffset2 = hoffset2;

                if (outh == -233)
                    _outc = channels - _coffset - _coffset2;
                else
                    _outc = std::min(outh, channels - _coffset - _coffset2);
            }
            else
            {
                if (outw == -233)
                    _outw = w - _woffset - _woffset2;
                else
                    _outw = std::min(outw, w - _woffset - _woffset2);

                if (outh == -233)
                    _outh = h - _hoffset - _hoffset2;
                else
                    _outh = std::min(outh, h - _hoffset - _hoffset2);

                if (outc == -233)
                    _outc = channels - _coffset - _coffset2;
                else
                    _outc = std::min(outc, channels - _coffset - _coffset2);
            }
        }
    }

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        else if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);

        return 0;
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        else if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);

        return 0;
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<_outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            else if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }

        return 0;
    }

    return 0;
}